

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall Imf_3_4::TimeCode::setHours(TimeCode *this,int value)

{
  uint field;
  ArgExc *this_00;
  int in_ESI;
  uint *in_RDI;
  
  if ((-1 < in_ESI) && (in_ESI < 0x18)) {
    field = anon_unknown_1::binaryToBcd(in_ESI);
    anon_unknown_1::setBitField(in_RDI,0x18,0x1d,field);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Cannot set hours field in time code. New value is out of range.")
  ;
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setHours (int value)
{
    if (value < 0 || value > 23)
        throw IEX_NAMESPACE::ArgExc ("Cannot set hours field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 24, 29, binaryToBcd (value));
}